

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCRayN *pRVar7;
  RTCRayN *pRVar8;
  RTCRayN *pRVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  float **ppfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  Geometry *pGVar21;
  RTCFilterFunctionN p_Var22;
  long lVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined8 uVar33;
  undefined8 uVar34;
  undefined1 auVar35 [16];
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  ulong uVar40;
  RTCRayN *pRVar41;
  uint uVar42;
  undefined1 (*pauVar43) [16];
  ulong uVar44;
  Scene *pSVar45;
  NodeRef *pNVar46;
  uint *puVar47;
  ulong uVar48;
  int iVar49;
  ulong uVar50;
  ulong uVar51;
  bool bVar52;
  float fVar53;
  float fVar66;
  float fVar67;
  undefined1 auVar54 [16];
  float fVar68;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  float fVar84;
  float fVar85;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar86;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar107;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar137;
  float fVar138;
  float fVar141;
  float fVar143;
  float fVar145;
  undefined1 auVar139 [16];
  float fVar142;
  float fVar144;
  float fVar146;
  undefined1 auVar140 [16];
  float fVar148;
  undefined1 auVar147 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fStack_cb4;
  float fStack_c94;
  float local_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float local_c58;
  float fStack_c54;
  float fStack_c50;
  float local_c48;
  float fStack_c44;
  float fStack_c40;
  float fStack_c3c;
  undefined1 local_c38 [16];
  Scene *scene;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  undefined8 local_c08;
  undefined8 uStack_c00;
  long local_bf8;
  undefined1 (*local_bf0) [16];
  RTCFilterFunctionNArguments args;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float fStack_aec;
  float fStack_adc;
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [8];
  float fStack_a40;
  float fStack_a3c;
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  RTCHitN local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined4 local_9c8;
  undefined4 uStack_9c4;
  undefined4 uStack_9c0;
  undefined4 uStack_9bc;
  undefined1 local_9b8 [16];
  undefined4 local_9a8;
  undefined4 uStack_9a4;
  undefined4 uStack_9a0;
  undefined4 uStack_99c;
  uint local_998;
  uint uStack_994;
  uint uStack_990;
  uint uStack_98c;
  uint local_988;
  uint uStack_984;
  uint uStack_980;
  uint uStack_97c;
  uint local_978;
  uint uStack_974;
  uint uStack_970;
  uint uStack_96c;
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  undefined8 local_898;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  uVar39 = mm_lookupmask_ps._252_4_;
  uVar38 = mm_lookupmask_ps._248_4_;
  uVar37 = mm_lookupmask_ps._244_4_;
  uVar36 = mm_lookupmask_ps._240_4_;
  pNVar46 = stack + 1;
  stack[0] = root;
  local_8c8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_8d8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_8e8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_8f8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_908 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_918 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_938 = local_8f8 * 0.99999964;
  local_948 = local_908 * 0.99999964;
  local_928 = local_918 * 0.99999964;
  local_8f8 = local_8f8 * 1.0000004;
  local_908 = local_908 * 1.0000004;
  local_918 = local_918 * 1.0000004;
  iVar16 = *(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar49 = (tray->tnear).field_0.i[k];
  local_958._4_4_ = iVar49;
  local_958._0_4_ = iVar49;
  local_958._8_4_ = iVar49;
  local_958._12_4_ = iVar49;
  iVar49 = (tray->tfar).field_0.i[k];
  local_968._4_4_ = iVar49;
  local_968._0_4_ = iVar49;
  local_968._8_4_ = iVar49;
  local_968._12_4_ = iVar49;
  local_7e8 = mm_lookupmask_ps._0_16_;
  pauVar43 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar52 = true;
  fStack_8f4 = local_8f8;
  fStack_8f0 = local_8f8;
  fStack_8ec = local_8f8;
  fStack_904 = local_908;
  fStack_900 = local_908;
  fStack_8fc = local_908;
  fStack_924 = local_928;
  fStack_920 = local_928;
  fStack_91c = local_928;
  fStack_934 = local_938;
  fStack_930 = local_938;
  fStack_92c = local_938;
  fStack_8c4 = local_8c8;
  fStack_8c0 = local_8c8;
  fStack_8bc = local_8c8;
  fStack_8d4 = local_8d8;
  fStack_8d0 = local_8d8;
  fStack_8cc = local_8d8;
  fStack_8e4 = local_8e8;
  fStack_8e0 = local_8e8;
  fStack_8dc = local_8e8;
  fStack_914 = local_918;
  fStack_910 = local_918;
  fStack_90c = local_918;
  fStack_944 = local_948;
  fStack_940 = local_948;
  fStack_93c = local_948;
  local_bf0 = pauVar43;
  do {
    uVar44 = pNVar46[-1].ptr;
    pNVar46 = pNVar46 + -1;
    while ((uVar44 & 8) == 0) {
      pfVar13 = (float *)(uVar44 + 0x20 + (long)iVar16);
      auVar54._0_4_ = (*pfVar13 - local_8c8) * local_938;
      auVar54._4_4_ = (pfVar13[1] - fStack_8c4) * fStack_934;
      auVar54._8_4_ = (pfVar13[2] - fStack_8c0) * fStack_930;
      auVar54._12_4_ = (pfVar13[3] - fStack_8bc) * fStack_92c;
      pfVar13 = (float *)(uVar44 + 0x20 + uVar50);
      auVar89._0_4_ = (*pfVar13 - local_8d8) * local_948;
      auVar89._4_4_ = (pfVar13[1] - fStack_8d4) * fStack_944;
      auVar89._8_4_ = (pfVar13[2] - fStack_8d0) * fStack_940;
      auVar89._12_4_ = (pfVar13[3] - fStack_8cc) * fStack_93c;
      auVar54 = maxps(auVar54,auVar89);
      pfVar13 = (float *)(uVar44 + 0x20 + uVar51);
      auVar70._0_4_ = (*pfVar13 - local_8e8) * local_928;
      auVar70._4_4_ = (pfVar13[1] - fStack_8e4) * fStack_924;
      auVar70._8_4_ = (pfVar13[2] - fStack_8e0) * fStack_920;
      auVar70._12_4_ = (pfVar13[3] - fStack_8dc) * fStack_91c;
      auVar71 = maxps(auVar70,local_958);
      auVar54 = maxps(auVar54,auVar71);
      pfVar13 = (float *)(uVar44 + 0x20 + ((long)iVar16 ^ 0x10U));
      auVar72._0_4_ = (*pfVar13 - local_8c8) * local_8f8;
      auVar72._4_4_ = (pfVar13[1] - fStack_8c4) * fStack_8f4;
      auVar72._8_4_ = (pfVar13[2] - fStack_8c0) * fStack_8f0;
      auVar72._12_4_ = (pfVar13[3] - fStack_8bc) * fStack_8ec;
      pfVar13 = (float *)(uVar44 + 0x20 + (uVar50 ^ 0x10));
      auVar87._0_4_ = (*pfVar13 - local_8d8) * local_908;
      auVar87._4_4_ = (pfVar13[1] - fStack_8d4) * fStack_904;
      auVar87._8_4_ = (pfVar13[2] - fStack_8d0) * fStack_900;
      auVar87._12_4_ = (pfVar13[3] - fStack_8cc) * fStack_8fc;
      auVar71 = minps(auVar72,auVar87);
      pfVar13 = (float *)(uVar44 + 0x20 + (uVar51 ^ 0x10));
      auVar88._0_4_ = (*pfVar13 - local_8e8) * local_918;
      auVar88._4_4_ = (pfVar13[1] - fStack_8e4) * fStack_914;
      auVar88._8_4_ = (pfVar13[2] - fStack_8e0) * fStack_910;
      auVar88._12_4_ = (pfVar13[3] - fStack_8dc) * fStack_90c;
      auVar89 = minps(auVar88,local_968);
      auVar89 = minps(auVar71,auVar89);
      auVar71._4_4_ = -(uint)(auVar54._4_4_ <= auVar89._4_4_);
      auVar71._0_4_ = -(uint)(auVar54._0_4_ <= auVar89._0_4_);
      auVar71._8_4_ = -(uint)(auVar54._8_4_ <= auVar89._8_4_);
      auVar71._12_4_ = -(uint)(auVar54._12_4_ <= auVar89._12_4_);
      uVar42 = movmskps((int)pauVar43,auVar71);
      pauVar43 = (undefined1 (*) [16])(ulong)uVar42;
      if (uVar42 == 0) goto LAB_0027e8c6;
      uVar40 = uVar44 & 0xfffffffffffffff0;
      lVar23 = 0;
      if ((byte)uVar42 != 0) {
        for (; ((byte)uVar42 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      uVar44 = *(ulong *)(uVar40 + lVar23 * 8);
      uVar42 = (uVar42 & 0xff) - 1 & uVar42 & 0xff;
      pauVar43 = (undefined1 (*) [16])(ulong)uVar42;
      if (uVar42 != 0) {
        pNVar46->ptr = uVar44;
        pNVar46 = pNVar46 + 1;
        lVar23 = 0;
        if (pauVar43 != (undefined1 (*) [16])0x0) {
          for (; (uVar42 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
          }
        }
        uVar44 = *(ulong *)(uVar40 + lVar23 * 8);
        uVar42 = uVar42 - 1 & uVar42;
        uVar48 = (ulong)uVar42;
        if (uVar42 != 0) {
          do {
            pNVar46->ptr = uVar44;
            pNVar46 = pNVar46 + 1;
            pauVar43 = (undefined1 (*) [16])0x0;
            if (uVar48 != 0) {
              for (; (uVar48 >> (long)pauVar43 & 1) == 0;
                  pauVar43 = (undefined1 (*) [16])(*pauVar43 + 1)) {
              }
            }
            uVar44 = *(ulong *)(uVar40 + (long)pauVar43 * 8);
            uVar48 = uVar48 & uVar48 - 1;
          } while (uVar48 != 0);
        }
      }
    }
    uVar40 = (ulong)((uint)uVar44 & 0xf);
    if (uVar40 != 8) {
      pauVar43 = (undefined1 (*) [16])0x0;
      do {
        pSVar45 = context->scene;
        puVar1 = (uint *)((uVar44 & 0xfffffffffffffff0) + (long)pauVar43 * 0x60);
        puVar47 = puVar1 + 0x10;
        ppfVar17 = (pSVar45->vertices).items;
        pfVar18 = ppfVar17[*puVar47];
        pfVar13 = pfVar18 + *puVar1;
        pfVar2 = pfVar18 + puVar1[4];
        pfVar3 = pfVar18 + puVar1[0xc];
        pfVar19 = ppfVar17[puVar1[0x11]];
        pfVar4 = pfVar19 + puVar1[1];
        pfVar5 = pfVar19 + puVar1[5];
        pfVar6 = pfVar19 + puVar1[0xd];
        pRVar41 = (RTCRayN *)ppfVar17[puVar1[0x12]];
        pRVar7 = pRVar41 + (ulong)puVar1[2] * 4;
        pRVar8 = pRVar41 + (ulong)puVar1[6] * 4;
        pRVar9 = pRVar41 + (ulong)puVar1[0xe] * 4;
        pfVar20 = ppfVar17[puVar1[0x13]];
        pfVar10 = pfVar20 + puVar1[3];
        pfVar11 = pfVar20 + puVar1[7];
        pfVar12 = pfVar20 + puVar1[0xf];
        fVar68 = *(float *)(ray + k * 4);
        fStack_adc = *(float *)(ray + k * 4 + 0x10);
        fStack_aec = *(float *)(ray + k * 4 + 0x20);
        fVar117 = *pfVar13 - fVar68;
        fVar120 = *pfVar4 - fVar68;
        fVar121 = *(float *)pRVar7 - fVar68;
        fVar122 = *pfVar10 - fVar68;
        fVar152 = pfVar13[1] - fStack_adc;
        fVar156 = pfVar4[1] - fStack_adc;
        fVar158 = *(float *)(pRVar7 + 4) - fStack_adc;
        fVar160 = pfVar10[1] - fStack_adc;
        fVar123 = pfVar13[2] - fStack_aec;
        fVar125 = pfVar4[2] - fStack_aec;
        fVar127 = *(float *)(pRVar7 + 8) - fStack_aec;
        fVar129 = pfVar10[2] - fStack_aec;
        fVar99 = *pfVar2 - fVar68;
        fVar104 = *pfVar5 - fVar68;
        fVar105 = *(float *)pRVar8 - fVar68;
        fVar106 = *pfVar11 - fVar68;
        local_868 = CONCAT44(*pfVar6,*pfVar3);
        local_858 = *(float *)pRVar9;
        fStack_854 = *pfVar12;
        fVar53 = *pfVar3 - fVar68;
        fVar66 = *pfVar6 - fVar68;
        fVar67 = *(float *)pRVar9 - fVar68;
        fVar68 = *pfVar12 - fVar68;
        local_8b8 = pfVar3[1];
        fStack_8b4 = pfVar6[1];
        fStack_8b0 = *(float *)(pRVar9 + 4);
        fStack_8ac = pfVar12[1];
        local_c48 = pfVar3[1] - fStack_adc;
        fStack_c44 = pfVar6[1] - fStack_adc;
        fStack_c40 = *(float *)(pRVar9 + 4) - fStack_adc;
        fStack_c3c = pfVar12[1] - fStack_adc;
        local_898 = CONCAT44(pfVar6[2],pfVar3[2]);
        local_c78 = pfVar3[2] - fStack_aec;
        fStack_c74 = pfVar6[2] - fStack_aec;
        fStack_c70 = *(float *)(pRVar9 + 8) - fStack_aec;
        fStack_c6c = pfVar12[2] - fStack_aec;
        fVar69 = fVar53 - fVar117;
        fVar84 = fVar66 - fVar120;
        fVar85 = fVar67 - fVar121;
        fVar86 = fVar68 - fVar122;
        local_7f8 = local_c48 - fVar152;
        fStack_7f4 = fStack_c44 - fVar156;
        fStack_7f0 = fStack_c40 - fVar158;
        fStack_7ec = fStack_c3c - fVar160;
        fVar107 = local_c78 - fVar123;
        fVar110 = fStack_c74 - fVar125;
        fVar111 = fStack_c70 - fVar127;
        fVar112 = fStack_c6c - fVar129;
        fStack_cb4 = *(float *)(ray + k * 4 + 0x50);
        fStack_c94 = *(float *)(ray + k * 4 + 0x60);
        fVar148 = *(float *)(ray + k * 4 + 0x40);
        local_838 = (local_7f8 * (local_c78 + fVar123) - (local_c48 + fVar152) * fVar107) * fVar148
                    + ((fVar53 + fVar117) * fVar107 - (local_c78 + fVar123) * fVar69) * fStack_cb4 +
                      (fVar69 * (local_c48 + fVar152) - (fVar53 + fVar117) * local_7f8) * fStack_c94
        ;
        fStack_834 = (fStack_7f4 * (fStack_c74 + fVar125) - (fStack_c44 + fVar156) * fVar110) *
                     fVar148 + ((fVar66 + fVar120) * fVar110 - (fStack_c74 + fVar125) * fVar84) *
                               fStack_cb4 +
                               (fVar84 * (fStack_c44 + fVar156) - (fVar66 + fVar120) * fStack_7f4) *
                               fStack_c94;
        fStack_830 = (fStack_7f0 * (fStack_c70 + fVar127) - (fStack_c40 + fVar158) * fVar111) *
                     fVar148 + ((fVar67 + fVar121) * fVar111 - (fStack_c70 + fVar127) * fVar85) *
                               fStack_cb4 +
                               (fVar85 * (fStack_c40 + fVar158) - (fVar67 + fVar121) * fStack_7f0) *
                               fStack_c94;
        fStack_82c = (fStack_7ec * (fStack_c6c + fVar129) - (fStack_c3c + fVar160) * fVar112) *
                     fVar148 + ((fVar68 + fVar122) * fVar112 - (fStack_c6c + fVar129) * fVar86) *
                               fStack_cb4 +
                               (fVar86 * (fStack_c3c + fVar160) - (fVar68 + fVar122) * fStack_7ec) *
                               fStack_c94;
        local_8a8 = pfVar2[1];
        fStack_8a4 = pfVar5[1];
        fStack_8a0 = *(float *)(pRVar8 + 4);
        fStack_89c = pfVar11[1];
        local_b38 = pfVar2[1] - fStack_adc;
        fStack_b34 = pfVar5[1] - fStack_adc;
        fStack_b30 = *(float *)(pRVar8 + 4) - fStack_adc;
        fStack_b2c = pfVar11[1] - fStack_adc;
        local_888 = pfVar2[2];
        fStack_884 = pfVar5[2];
        fStack_880 = *(float *)(pRVar8 + 8);
        fStack_87c = pfVar11[2];
        local_b28 = pfVar2[2] - fStack_aec;
        fStack_b24 = pfVar5[2] - fStack_aec;
        fStack_b20 = *(float *)(pRVar8 + 8) - fStack_aec;
        fStack_b1c = pfVar11[2] - fStack_aec;
        fVar137 = fVar117 - fVar99;
        fVar141 = fVar120 - fVar104;
        fVar143 = fVar121 - fVar105;
        fVar145 = fVar122 - fVar106;
        fVar131 = fVar152 - local_b38;
        fVar134 = fVar156 - fStack_b34;
        fVar135 = fVar158 - fStack_b30;
        fVar136 = fVar160 - fStack_b2c;
        local_808 = fVar123 - local_b28;
        fStack_804 = fVar125 - fStack_b24;
        fStack_800 = fVar127 - fStack_b20;
        fStack_7fc = fVar129 - fStack_b1c;
        local_848 = (fVar131 * (fVar123 + local_b28) - (fVar152 + local_b38) * local_808) * fVar148
                    + ((fVar117 + fVar99) * local_808 - (fVar123 + local_b28) * fVar137) *
                      fStack_cb4 +
                      (fVar137 * (fVar152 + local_b38) - (fVar117 + fVar99) * fVar131) * fStack_c94;
        fStack_844 = (fVar134 * (fVar125 + fStack_b24) - (fVar156 + fStack_b34) * fStack_804) *
                     fVar148 + ((fVar120 + fVar104) * fStack_804 - (fVar125 + fStack_b24) * fVar141)
                               * fStack_cb4 +
                               (fVar141 * (fVar156 + fStack_b34) - (fVar120 + fVar104) * fVar134) *
                               fStack_c94;
        fStack_840 = (fVar135 * (fVar127 + fStack_b20) - (fVar158 + fStack_b30) * fStack_800) *
                     fVar148 + ((fVar121 + fVar105) * fStack_800 - (fVar127 + fStack_b20) * fVar143)
                               * fStack_cb4 +
                               (fVar143 * (fVar158 + fStack_b30) - (fVar121 + fVar105) * fVar135) *
                               fStack_c94;
        fStack_83c = (fVar136 * (fVar129 + fStack_b1c) - (fVar160 + fStack_b2c) * fStack_7fc) *
                     fVar148 + ((fVar122 + fVar106) * fStack_7fc - (fVar129 + fStack_b1c) * fVar145)
                               * fStack_cb4 +
                               (fVar145 * (fVar160 + fStack_b2c) - (fVar122 + fVar106) * fVar136) *
                               fStack_c94;
        fVar153 = fVar99 - fVar53;
        fVar157 = fVar104 - fVar66;
        fVar159 = fVar105 - fVar67;
        fVar161 = fVar106 - fVar68;
        fVar113 = local_b38 - local_c48;
        fVar114 = fStack_b34 - fStack_c44;
        fVar115 = fStack_b30 - fStack_c40;
        fVar116 = fStack_b2c - fStack_c3c;
        fVar124 = local_b28 - local_c78;
        fVar126 = fStack_b24 - fStack_c74;
        fVar128 = fStack_b20 - fStack_c70;
        fVar130 = fStack_b1c - fStack_c6c;
        local_b18 = local_b38 + local_c48;
        fStack_b14 = fStack_b34 + fStack_c44;
        fStack_b10 = fStack_b30 + fStack_c40;
        fStack_b0c = fStack_b2c + fStack_c3c;
        local_b08 = local_b28 + local_c78;
        fStack_b04 = fStack_b24 + fStack_c74;
        fStack_b00 = fStack_b20 + fStack_c70;
        fStack_afc = fStack_b1c + fStack_c6c;
        auVar73._0_4_ =
             (fVar113 * local_b08 - local_b18 * fVar124) * fVar148 +
             ((fVar53 + fVar99) * fVar124 - fVar153 * local_b08) * fStack_cb4 +
             (fVar153 * local_b18 - (fVar53 + fVar99) * fVar113) * fStack_c94;
        auVar73._4_4_ =
             (fVar114 * fStack_b04 - fStack_b14 * fVar126) * fVar148 +
             ((fVar66 + fVar104) * fVar126 - fVar157 * fStack_b04) * fStack_cb4 +
             (fVar157 * fStack_b14 - (fVar66 + fVar104) * fVar114) * fStack_c94;
        auVar73._8_4_ =
             (fVar115 * fStack_b00 - fStack_b10 * fVar128) * fVar148 +
             ((fVar67 + fVar105) * fVar128 - fVar159 * fStack_b00) * fStack_cb4 +
             (fVar159 * fStack_b10 - (fVar67 + fVar105) * fVar115) * fStack_c94;
        auVar73._12_4_ =
             (fVar116 * fStack_afc - fStack_b0c * fVar130) * fVar148 +
             ((fVar68 + fVar106) * fVar130 - fVar161 * fStack_afc) * fStack_cb4 +
             (fVar161 * fStack_b0c - (fVar68 + fVar106) * fVar116) * fStack_c94;
        auVar96._0_4_ = local_838 + local_848 + auVar73._0_4_;
        auVar96._4_4_ = fStack_834 + fStack_844 + auVar73._4_4_;
        auVar96._8_4_ = fStack_830 + fStack_840 + auVar73._8_4_;
        auVar96._12_4_ = fStack_82c + fStack_83c + auVar73._12_4_;
        auVar55._4_4_ = fStack_834;
        auVar55._0_4_ = local_838;
        auVar55._8_4_ = fStack_830;
        auVar55._12_4_ = fStack_82c;
        auVar25._4_4_ = fStack_844;
        auVar25._0_4_ = local_848;
        auVar25._8_4_ = fStack_840;
        auVar25._12_4_ = fStack_83c;
        auVar54 = minps(auVar55,auVar25);
        auVar54 = minps(auVar54,auVar73);
        auVar100._4_4_ = fStack_834;
        auVar100._0_4_ = local_838;
        auVar100._8_4_ = fStack_830;
        auVar100._12_4_ = fStack_82c;
        auVar26._4_4_ = fStack_844;
        auVar26._0_4_ = local_848;
        auVar26._8_4_ = fStack_840;
        auVar26._12_4_ = fStack_83c;
        auVar71 = maxps(auVar100,auVar26);
        auVar71 = maxps(auVar71,auVar73);
        fVar68 = ABS(auVar96._0_4_) * 1.1920929e-07;
        fVar53 = ABS(auVar96._4_4_) * 1.1920929e-07;
        fVar66 = ABS(auVar96._8_4_) * 1.1920929e-07;
        fVar67 = ABS(auVar96._12_4_) * 1.1920929e-07;
        auVar101._4_4_ = -(uint)(auVar71._4_4_ <= fVar53);
        auVar101._0_4_ = -(uint)(auVar71._0_4_ <= fVar68);
        auVar101._8_4_ = -(uint)(auVar71._8_4_ <= fVar66);
        auVar101._12_4_ = -(uint)(auVar71._12_4_ <= fVar67);
        auVar56._4_4_ = -(uint)(-fVar53 <= auVar54._4_4_);
        auVar56._0_4_ = -(uint)(-fVar68 <= auVar54._0_4_);
        auVar56._8_4_ = -(uint)(-fVar66 <= auVar54._8_4_);
        auVar56._12_4_ = -(uint)(-fVar67 <= auVar54._12_4_);
        auVar101 = auVar101 | auVar56;
        local_bf8 = (uVar44 & 0xfffffffffffffff0) + (long)pauVar43 * 0x60;
        iVar49 = movmskps(iVar16,auVar101);
        auVar54 = *(undefined1 (*) [16])(pfVar18 + puVar1[8]);
        uVar33 = *(undefined8 *)(pfVar19 + puVar1[9]);
        uVar34 = *(undefined8 *)(pfVar19 + puVar1[9] + 2);
        local_878 = *(undefined8 *)(pRVar41 + (ulong)puVar1[10] * 4);
        uStack_870 = *(undefined8 *)(pRVar41 + (ulong)puVar1[10] * 4 + 8);
        local_c08 = *(undefined8 *)(pfVar20 + puVar1[0xb]);
        uStack_c00 = *(undefined8 *)(pfVar20 + puVar1[0xb] + 2);
        scene = pSVar45;
        if (iVar49 != 0) {
          local_818 = fVar113;
          fStack_814 = fVar114;
          fStack_810 = fVar115;
          fStack_80c = fVar116;
          local_828 = fVar124;
          fStack_824 = fVar126;
          fStack_820 = fVar128;
          fStack_81c = fVar130;
          auVar132._0_4_ = fVar131 * fVar124 - fVar113 * local_808;
          auVar132._4_4_ = fVar134 * fVar126 - fVar114 * fStack_804;
          auVar132._8_4_ = fVar135 * fVar128 - fVar115 * fStack_800;
          auVar132._12_4_ = fVar136 * fVar130 - fVar116 * fStack_7fc;
          auVar57._4_4_ = -(uint)(ABS(fVar134 * fVar110) < ABS(fVar114 * fStack_804));
          auVar57._0_4_ = -(uint)(ABS(fVar131 * fVar107) < ABS(fVar113 * local_808));
          auVar57._8_4_ = -(uint)(ABS(fVar135 * fVar111) < ABS(fVar115 * fStack_800));
          auVar57._12_4_ = -(uint)(ABS(fVar136 * fVar112) < ABS(fVar116 * fStack_7fc));
          auVar27._4_4_ = fStack_7f4 * fStack_804 - fVar134 * fVar110;
          auVar27._0_4_ = local_7f8 * local_808 - fVar131 * fVar107;
          auVar27._8_4_ = fStack_7f0 * fStack_800 - fVar135 * fVar111;
          auVar27._12_4_ = fStack_7ec * fStack_7fc - fVar136 * fVar112;
          local_a38 = blendvps(auVar132,auVar27,auVar57);
          auVar154._0_4_ = fVar153 * local_808 - fVar137 * fVar124;
          auVar154._4_4_ = fVar157 * fStack_804 - fVar141 * fVar126;
          auVar154._8_4_ = fVar159 * fStack_800 - fVar143 * fVar128;
          auVar154._12_4_ = fVar161 * fStack_7fc - fVar145 * fVar130;
          auVar58._4_4_ = -(uint)(ABS(fVar84 * fStack_804) < ABS(fVar141 * fVar126));
          auVar58._0_4_ = -(uint)(ABS(fVar69 * local_808) < ABS(fVar137 * fVar124));
          auVar58._8_4_ = -(uint)(ABS(fVar85 * fStack_800) < ABS(fVar143 * fVar128));
          auVar58._12_4_ = -(uint)(ABS(fVar86 * fStack_7fc) < ABS(fVar145 * fVar130));
          auVar29._4_4_ = fVar110 * fVar141 - fVar84 * fStack_804;
          auVar29._0_4_ = fVar107 * fVar137 - fVar69 * local_808;
          auVar29._8_4_ = fVar111 * fVar143 - fVar85 * fStack_800;
          auVar29._12_4_ = fVar112 * fVar145 - fVar86 * fStack_7fc;
          local_a28 = blendvps(auVar154,auVar29,auVar58);
          auVar108._0_4_ = fVar69 * fVar131 - fVar137 * local_7f8;
          auVar108._4_4_ = fVar84 * fVar134 - fVar141 * fStack_7f4;
          auVar108._8_4_ = fVar85 * fVar135 - fVar143 * fStack_7f0;
          auVar108._12_4_ = fVar86 * fVar136 - fVar145 * fStack_7ec;
          auVar139._0_4_ = fVar137 * fVar113 - fVar153 * fVar131;
          auVar139._4_4_ = fVar141 * fVar114 - fVar157 * fVar134;
          auVar139._8_4_ = fVar143 * fVar115 - fVar159 * fVar135;
          auVar139._12_4_ = fVar145 * fVar116 - fVar161 * fVar136;
          auVar59._4_4_ = -(uint)(ABS(fVar141 * fStack_7f4) < ABS(fVar157 * fVar134));
          auVar59._0_4_ = -(uint)(ABS(fVar137 * local_7f8) < ABS(fVar153 * fVar131));
          auVar59._8_4_ = -(uint)(ABS(fVar143 * fStack_7f0) < ABS(fVar159 * fVar135));
          auVar59._12_4_ = -(uint)(ABS(fVar145 * fStack_7ec) < ABS(fVar161 * fVar136));
          local_a18 = blendvps(auVar139,auVar108,auVar59);
          fVar68 = fVar148 * local_a38._0_4_ +
                   fStack_cb4 * local_a28._0_4_ + fStack_c94 * local_a18._0_4_;
          fVar53 = fVar148 * local_a38._4_4_ +
                   fStack_cb4 * local_a28._4_4_ + fStack_c94 * local_a18._4_4_;
          fVar66 = fVar148 * local_a38._8_4_ +
                   fStack_cb4 * local_a28._8_4_ + fStack_c94 * local_a18._8_4_;
          fVar67 = fVar148 * local_a38._12_4_ +
                   fStack_cb4 * local_a28._12_4_ + fStack_c94 * local_a18._12_4_;
          auVar74._0_4_ = fVar68 + fVar68;
          auVar74._4_4_ = fVar53 + fVar53;
          auVar74._8_4_ = fVar66 + fVar66;
          auVar74._12_4_ = fVar67 + fVar67;
          auVar90._0_4_ = fVar152 * local_a28._0_4_ + fVar123 * local_a18._0_4_;
          auVar90._4_4_ = fVar156 * local_a28._4_4_ + fVar125 * local_a18._4_4_;
          auVar90._8_4_ = fVar158 * local_a28._8_4_ + fVar127 * local_a18._8_4_;
          auVar90._12_4_ = fVar160 * local_a28._12_4_ + fVar129 * local_a18._12_4_;
          fVar99 = fVar117 * local_a38._0_4_ + auVar90._0_4_;
          fVar104 = fVar120 * local_a38._4_4_ + auVar90._4_4_;
          fVar105 = fVar121 * local_a38._8_4_ + auVar90._8_4_;
          fVar106 = fVar122 * local_a38._12_4_ + auVar90._12_4_;
          auVar71 = rcpps(auVar90,auVar74);
          fVar68 = auVar71._0_4_;
          fVar66 = auVar71._4_4_;
          fVar67 = auVar71._8_4_;
          fVar69 = auVar71._12_4_;
          fVar84 = (float)DAT_01f7ba10;
          fVar85 = DAT_01f7ba10._4_4_;
          fVar86 = DAT_01f7ba10._12_4_;
          fVar53 = DAT_01f7ba10._8_4_;
          local_a48._0_4_ =
               ((fVar84 - auVar74._0_4_ * fVar68) * fVar68 + fVar68) * (fVar99 + fVar99);
          local_a48._4_4_ =
               ((fVar85 - auVar74._4_4_ * fVar66) * fVar66 + fVar66) * (fVar104 + fVar104);
          fStack_a40 = ((fVar53 - auVar74._8_4_ * fVar67) * fVar67 + fVar67) * (fVar105 + fVar105);
          fStack_a3c = ((fVar86 - auVar74._12_4_ * fVar69) * fVar69 + fVar69) * (fVar106 + fVar106);
          local_c18 = *(float *)(ray + k * 4 + 0x80);
          fStack_c14 = 0.0;
          fStack_c10 = 0.0;
          fStack_c0c = 0.0;
          fVar68 = *(float *)(ray + k * 4 + 0x30);
          auVar91._0_4_ =
               -(uint)((float)local_a48._0_4_ <= local_c18 && fVar68 <= (float)local_a48._0_4_) &
               auVar101._0_4_;
          auVar91._4_4_ =
               -(uint)((float)local_a48._4_4_ <= local_c18 && fVar68 <= (float)local_a48._4_4_) &
               auVar101._4_4_;
          auVar91._8_4_ = -(uint)(fStack_a40 <= local_c18 && fVar68 <= fStack_a40) & auVar101._8_4_;
          auVar91._12_4_ =
               -(uint)(fStack_a3c <= local_c18 && fVar68 <= fStack_a3c) & auVar101._12_4_;
          uVar42 = movmskps((int)pRVar41,auVar91);
          pRVar41 = (RTCRayN *)(ulong)uVar42;
          if (uVar42 != 0) {
            auVar92._0_4_ = auVar91._0_4_ & -(uint)(auVar74._0_4_ != 0.0);
            auVar92._4_4_ = auVar91._4_4_ & -(uint)(auVar74._4_4_ != 0.0);
            auVar92._8_4_ = auVar91._8_4_ & -(uint)(auVar74._8_4_ != 0.0);
            auVar92._12_4_ = auVar91._12_4_ & -(uint)(auVar74._12_4_ != 0.0);
            uVar42 = movmskps(uVar42,auVar92);
            pRVar41 = (RTCRayN *)(ulong)uVar42;
            if (uVar42 != 0) {
              local_a08 = local_7e8;
              auVar71 = rcpps(auVar92,auVar96);
              fVar68 = auVar71._0_4_;
              fVar148 = auVar71._4_4_;
              fVar66 = auVar71._8_4_;
              fVar67 = auVar71._12_4_;
              fVar68 = (float)(-(uint)(1e-18 <= ABS(auVar96._0_4_)) &
                              (uint)((fVar84 - auVar96._0_4_ * fVar68) * fVar68 + fVar68));
              fVar148 = (float)(-(uint)(1e-18 <= ABS(auVar96._4_4_)) &
                               (uint)((fVar85 - auVar96._4_4_ * fVar148) * fVar148 + fVar148));
              fVar66 = (float)(-(uint)(1e-18 <= ABS(auVar96._8_4_)) &
                              (uint)((fVar53 - auVar96._8_4_ * fVar66) * fVar66 + fVar66));
              fVar67 = (float)(-(uint)(1e-18 <= ABS(auVar96._12_4_)) &
                              (uint)((fVar86 - auVar96._12_4_ * fVar67) * fVar67 + fVar67));
              auVar102._0_4_ = local_838 * fVar68;
              auVar102._4_4_ = fStack_834 * fVar148;
              auVar102._8_4_ = fStack_830 * fVar66;
              auVar102._12_4_ = fStack_82c * fVar67;
              auVar71 = minps(auVar102,_DAT_01f7ba10);
              auVar147._0_4_ = fVar68 * local_848;
              auVar147._4_4_ = fVar148 * fStack_844;
              auVar147._8_4_ = fVar66 * fStack_840;
              auVar147._12_4_ = fVar67 * fStack_83c;
              auVar89 = minps(auVar147,_DAT_01f7ba10);
              auVar75._0_4_ = fVar84 - auVar71._0_4_;
              auVar75._4_4_ = fVar85 - auVar71._4_4_;
              auVar75._8_4_ = fVar53 - auVar71._8_4_;
              auVar75._12_4_ = fVar86 - auVar71._12_4_;
              auVar93._0_4_ = fVar84 - auVar89._0_4_;
              auVar93._4_4_ = fVar85 - auVar89._4_4_;
              auVar93._8_4_ = fVar53 - auVar89._8_4_;
              auVar93._12_4_ = fVar86 - auVar89._12_4_;
              local_a68 = blendvps(auVar71,auVar75,local_7e8);
              local_a58 = blendvps(auVar89,auVar93,local_7e8);
              uVar48 = (ulong)(byte)uVar42;
              do {
                uVar24 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                local_998 = puVar47[uVar24];
                pGVar21 = (pSVar45->geometries).items[local_998].ptr;
                pRVar41 = (RTCRayN *)(ulong)*(uint *)(ray + k * 4 + 0x90);
                if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0027e8e6;
                  local_9c8 = *(undefined4 *)(local_a68 + uVar24 * 4);
                  uVar14 = *(undefined4 *)(local_a58 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_a48 + uVar24 * 4);
                  args.context = context->user;
                  local_9a8 = *(undefined4 *)(local_bf8 + 0x50 + uVar24 * 4);
                  local_9b8._4_4_ = uVar14;
                  local_9b8._0_4_ = uVar14;
                  local_9b8._8_4_ = uVar14;
                  local_9b8._12_4_ = uVar14;
                  uVar14 = *(undefined4 *)(local_a38 + uVar24 * 4);
                  local_9e8._4_4_ = *(undefined4 *)(local_a28 + uVar24 * 4);
                  local_9d8 = *(undefined4 *)(local_a18 + uVar24 * 4);
                  local_9f8[0] = (RTCHitN)(char)uVar14;
                  local_9f8[1] = (RTCHitN)(char)((uint)uVar14 >> 8);
                  local_9f8[2] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                  local_9f8[3] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                  local_9f8[4] = (RTCHitN)(char)uVar14;
                  local_9f8[5] = (RTCHitN)(char)((uint)uVar14 >> 8);
                  local_9f8[6] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                  local_9f8[7] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                  local_9f8[8] = (RTCHitN)(char)uVar14;
                  local_9f8[9] = (RTCHitN)(char)((uint)uVar14 >> 8);
                  local_9f8[10] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                  local_9f8[0xb] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                  local_9f8[0xc] = (RTCHitN)(char)uVar14;
                  local_9f8[0xd] = (RTCHitN)(char)((uint)uVar14 >> 8);
                  local_9f8[0xe] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                  local_9f8[0xf] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                  local_9e8._0_4_ = local_9e8._4_4_;
                  local_9e8._8_4_ = local_9e8._4_4_;
                  local_9e8._12_4_ = local_9e8._4_4_;
                  uStack_9d4 = local_9d8;
                  uStack_9d0 = local_9d8;
                  uStack_9cc = local_9d8;
                  uStack_9c4 = local_9c8;
                  uStack_9c0 = local_9c8;
                  uStack_9bc = local_9c8;
                  uStack_9a4 = local_9a8;
                  uStack_9a0 = local_9a8;
                  uStack_99c = local_9a8;
                  uStack_994 = local_998;
                  uStack_990 = local_998;
                  uStack_98c = local_998;
                  local_988 = (args.context)->instID[0];
                  uStack_984 = local_988;
                  uStack_980 = local_988;
                  uStack_97c = local_988;
                  local_978 = (args.context)->instPrimID[0];
                  uStack_974 = local_978;
                  uStack_970 = local_978;
                  uStack_96c = local_978;
                  local_c38 = *local_bf0;
                  args.valid = (int *)local_c38;
                  args.geometryUserPtr = pGVar21->userPtr;
                  args.hit = local_9f8;
                  args.N = 4;
                  pRVar41 = (RTCRayN *)pGVar21->occlusionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar41 != (RTCRayN *)0x0) {
                    pRVar41 = (RTCRayN *)(*(code *)pRVar41)(&args);
                    pSVar45 = scene;
                  }
                  if (local_c38 == (undefined1  [16])0x0) {
                    auVar76._8_4_ = 0xffffffff;
                    auVar76._0_8_ = 0xffffffffffffffff;
                    auVar76._12_4_ = 0xffffffff;
                    auVar76 = auVar76 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var22 = context->args->filter;
                    if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var22)(&args);
                      pSVar45 = scene;
                    }
                    auVar60._0_4_ = -(uint)(local_c38._0_4_ == 0);
                    auVar60._4_4_ = -(uint)(local_c38._4_4_ == 0);
                    auVar60._8_4_ = -(uint)(local_c38._8_4_ == 0);
                    auVar60._12_4_ = -(uint)(local_c38._12_4_ == 0);
                    auVar76 = auVar60 ^ _DAT_01f7ae20;
                    auVar71 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar60
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar71;
                    pRVar41 = args.ray;
                  }
                  if ((_DAT_01f7bb20 & auVar76) != (undefined1  [16])0x0) goto LAB_0027e8e6;
                  *(float *)(ray + k * 4 + 0x80) = local_c18;
                }
                uVar48 = uVar48 ^ 1L << (uVar24 & 0x3f);
              } while (uVar48 != 0);
              fStack_adc = *(float *)(ray + k * 4 + 0x10);
              fStack_aec = *(float *)(ray + k * 4 + 0x20);
              fVar148 = *(float *)(ray + k * 4 + 0x40);
              fStack_cb4 = *(float *)(ray + k * 4 + 0x50);
              fStack_c94 = *(float *)(ray + k * 4 + 0x60);
              local_c78 = (float)local_898 - fStack_aec;
              fStack_c74 = local_898._4_4_ - fStack_aec;
              fStack_c70 = fStack_890 - fStack_aec;
              fStack_c6c = fStack_88c - fStack_aec;
              local_b38 = local_8a8 - fStack_adc;
              fStack_b34 = fStack_8a4 - fStack_adc;
              fStack_b30 = fStack_8a0 - fStack_adc;
              fStack_b2c = fStack_89c - fStack_adc;
              local_b28 = local_888 - fStack_aec;
              fStack_b24 = fStack_884 - fStack_aec;
              fStack_b20 = fStack_880 - fStack_aec;
              fStack_b1c = fStack_87c - fStack_aec;
              local_b18 = (local_8b8 - fStack_adc) + local_b38;
              fStack_b14 = (fStack_8b4 - fStack_adc) + fStack_b34;
              fStack_b10 = (fStack_8b0 - fStack_adc) + fStack_b30;
              fStack_b0c = (fStack_8ac - fStack_adc) + fStack_b2c;
              local_b08 = local_c78 + local_b28;
              fStack_b04 = fStack_c74 + fStack_b24;
              fStack_b00 = fStack_c70 + fStack_b20;
              fStack_afc = fStack_c6c + fStack_b1c;
              fStack_c44 = fStack_8b4 - fStack_adc;
              local_c48 = local_8b8 - fStack_adc;
              fStack_c40 = fStack_8b0 - fStack_adc;
              fStack_c3c = fStack_8ac - fStack_adc;
            }
          }
        }
        local_c58 = (float)uVar33;
        fStack_c54 = (float)((ulong)uVar33 >> 0x20);
        fStack_c50 = (float)uVar34;
        fVar134 = auVar54._8_4_ - fStack_aec;
        fStack_c50 = fStack_c50 - fStack_aec;
        fVar135 = (float)uStack_870 - fStack_aec;
        fStack_aec = (float)uStack_c00 - fStack_aec;
        fVar143 = auVar54._4_4_ - fStack_adc;
        fStack_c54 = fStack_c54 - fStack_adc;
        fVar157 = local_878._4_4_ - fStack_adc;
        fStack_adc = local_c08._4_4_ - fStack_adc;
        fVar68 = *(float *)(ray + k * 4);
        fVar136 = auVar54._0_4_ - fVar68;
        local_c58 = local_c58 - fVar68;
        fVar137 = (float)local_878 - fVar68;
        fVar141 = (float)local_c08 - fVar68;
        fVar84 = (float)local_868 - fVar68;
        fVar99 = local_868._4_4_ - fVar68;
        fVar106 = fStack_860 - fVar68;
        fVar131 = fStack_85c - fVar68;
        fVar149 = local_858 - fVar68;
        fVar150 = fStack_854 - fVar68;
        fVar151 = fStack_850 - fVar68;
        fVar68 = fStack_84c - fVar68;
        local_c18 = fVar149 - fVar136;
        fStack_c14 = fVar150 - local_c58;
        fStack_c10 = fVar151 - fVar137;
        fStack_c0c = fVar68 - fVar141;
        fVar107 = local_b38 - fVar143;
        fVar111 = fStack_b34 - fStack_c54;
        fVar113 = fStack_b30 - fVar157;
        fVar115 = fStack_b2c - fStack_adc;
        fVar123 = local_b28 - fVar134;
        fVar125 = fStack_b24 - fStack_c50;
        fVar127 = fStack_b20 - fVar135;
        fVar129 = fStack_b1c - fStack_aec;
        fVar53 = local_c48 - local_b38;
        fVar67 = fStack_c44 - fStack_b34;
        fVar85 = fStack_c40 - fStack_b30;
        fVar104 = fStack_c3c - fStack_b2c;
        local_c08 = CONCAT44(fVar67,fVar53);
        uStack_c00 = CONCAT44(fVar104,fVar85);
        fVar66 = local_c78 - local_b28;
        fVar69 = fStack_c74 - fStack_b24;
        fVar86 = fStack_c70 - fStack_b20;
        fVar105 = fStack_c6c - fStack_b1c;
        fVar117 = fVar136 - fVar84;
        fVar120 = local_c58 - fVar99;
        fVar121 = fVar137 - fVar106;
        fVar122 = fVar141 - fVar131;
        fVar138 = (fVar107 * (local_b28 + fVar134) - (local_b38 + fVar143) * fVar123) * fVar148 +
                  ((fVar149 + fVar136) * fVar123 - (local_b28 + fVar134) * local_c18) * fStack_cb4 +
                  (local_c18 * (local_b38 + fVar143) - (fVar149 + fVar136) * fVar107) * fStack_c94;
        fVar142 = (fVar111 * (fStack_b24 + fStack_c50) - (fStack_b34 + fStack_c54) * fVar125) *
                  fVar148 + ((fVar150 + local_c58) * fVar125 -
                            (fStack_b24 + fStack_c50) * fStack_c14) * fStack_cb4 +
                            (fStack_c14 * (fStack_b34 + fStack_c54) -
                            (fVar150 + local_c58) * fVar111) * fStack_c94;
        fVar144 = (fVar113 * (fStack_b20 + fVar135) - (fStack_b30 + fVar157) * fVar127) * fVar148 +
                  ((fVar151 + fVar137) * fVar127 - (fStack_b20 + fVar135) * fStack_c10) * fStack_cb4
                  + (fStack_c10 * (fStack_b30 + fVar157) - (fVar151 + fVar137) * fVar113) *
                    fStack_c94;
        fVar146 = (fVar115 * (fStack_b1c + fStack_aec) - (fStack_b2c + fStack_adc) * fVar129) *
                  fVar148 + ((fVar68 + fVar141) * fVar129 - (fStack_b1c + fStack_aec) * fStack_c0c)
                            * fStack_cb4 +
                            (fStack_c0c * (fStack_b2c + fStack_adc) - (fVar68 + fVar141) * fVar115)
                            * fStack_c94;
        fVar124 = fVar143 - local_c48;
        fVar126 = fStack_c54 - fStack_c44;
        fVar128 = fVar157 - fStack_c40;
        fVar130 = fStack_adc - fStack_c3c;
        fVar110 = fVar134 - local_c78;
        fVar112 = fStack_c50 - fStack_c74;
        fVar114 = fVar135 - fStack_c70;
        fVar116 = fStack_aec - fStack_c6c;
        fVar145 = (fVar124 * (local_c78 + fVar134) - (local_c48 + fVar143) * fVar110) * fVar148 +
                  ((fVar136 + fVar84) * fVar110 - (local_c78 + fVar134) * fVar117) * fStack_cb4 +
                  (fVar117 * (local_c48 + fVar143) - (fVar136 + fVar84) * fVar124) * fStack_c94;
        fVar153 = (fVar126 * (fStack_c74 + fStack_c50) - (fStack_c44 + fStack_c54) * fVar112) *
                  fVar148 + ((local_c58 + fVar99) * fVar112 - (fStack_c74 + fStack_c50) * fVar120) *
                            fStack_cb4 +
                            (fVar120 * (fStack_c44 + fStack_c54) - (local_c58 + fVar99) * fVar126) *
                            fStack_c94;
        fVar158 = (fVar128 * (fStack_c70 + fVar135) - (fStack_c40 + fVar157) * fVar114) * fVar148 +
                  ((fVar137 + fVar106) * fVar114 - (fStack_c70 + fVar135) * fVar121) * fStack_cb4 +
                  (fVar121 * (fStack_c40 + fVar157) - (fVar137 + fVar106) * fVar128) * fStack_c94;
        fVar160 = (fVar130 * (fStack_c6c + fStack_aec) - (fStack_c3c + fStack_adc) * fVar116) *
                  fVar148 + ((fVar141 + fVar131) * fVar116 - (fStack_c6c + fStack_aec) * fVar122) *
                            fStack_cb4 +
                            (fVar122 * (fStack_c3c + fStack_adc) - (fVar141 + fVar131) * fVar130) *
                            fStack_c94;
        fVar152 = fVar84 - fVar149;
        fVar156 = fVar99 - fVar150;
        fVar159 = fVar106 - fVar151;
        fVar161 = fVar131 - fVar68;
        auVar61._0_4_ =
             (fVar53 * local_b08 - local_b18 * fVar66) * fVar148 +
             ((fVar149 + fVar84) * fVar66 - local_b08 * fVar152) * fStack_cb4 +
             (fVar152 * local_b18 - (fVar149 + fVar84) * fVar53) * fStack_c94;
        auVar61._4_4_ =
             (fVar67 * fStack_b04 - fStack_b14 * fVar69) * fVar148 +
             ((fVar150 + fVar99) * fVar69 - fStack_b04 * fVar156) * fStack_cb4 +
             (fVar156 * fStack_b14 - (fVar150 + fVar99) * fVar67) * fStack_c94;
        auVar61._8_4_ =
             (fVar85 * fStack_b00 - fStack_b10 * fVar86) * fVar148 +
             ((fVar151 + fVar106) * fVar86 - fStack_b00 * fVar159) * fStack_cb4 +
             (fVar159 * fStack_b10 - (fVar151 + fVar106) * fVar85) * fStack_c94;
        auVar61._12_4_ =
             (fVar104 * fStack_afc - fStack_b0c * fVar105) * fVar148 +
             ((fVar68 + fVar131) * fVar105 - fStack_afc * fVar161) * fStack_cb4 +
             (fVar161 * fStack_b0c - (fVar68 + fVar131) * fVar104) * fStack_c94;
        fVar131 = fVar138 + fVar145 + auVar61._0_4_;
        fVar149 = fVar142 + fVar153 + auVar61._4_4_;
        fVar150 = fVar144 + fVar158 + auVar61._8_4_;
        fVar151 = fVar146 + fVar160 + auVar61._12_4_;
        auVar77._8_4_ = fVar144;
        auVar77._0_8_ = CONCAT44(fVar142,fVar138);
        auVar77._12_4_ = fVar146;
        auVar30._8_4_ = fVar158;
        auVar30._0_8_ = CONCAT44(fVar153,fVar145);
        auVar30._12_4_ = fVar160;
        auVar54 = minps(auVar77,auVar30);
        auVar54 = minps(auVar54,auVar61);
        auVar97._8_4_ = fVar144;
        auVar97._0_8_ = CONCAT44(fVar142,fVar138);
        auVar97._12_4_ = fVar146;
        auVar31._8_4_ = fVar158;
        auVar31._0_8_ = CONCAT44(fVar153,fVar145);
        auVar31._12_4_ = fVar160;
        auVar71 = maxps(auVar97,auVar31);
        auVar71 = maxps(auVar71,auVar61);
        fVar68 = ABS(fVar131) * 1.1920929e-07;
        fVar84 = ABS(fVar149) * 1.1920929e-07;
        fVar99 = ABS(fVar150) * 1.1920929e-07;
        fVar106 = ABS(fVar151) * 1.1920929e-07;
        auVar98._4_4_ = -(uint)(auVar71._4_4_ <= fVar84);
        auVar98._0_4_ = -(uint)(auVar71._0_4_ <= fVar68);
        auVar98._8_4_ = -(uint)(auVar71._8_4_ <= fVar99);
        auVar98._12_4_ = -(uint)(auVar71._12_4_ <= fVar106);
        auVar78._4_4_ = -(uint)(-fVar84 <= auVar54._4_4_);
        auVar78._0_4_ = -(uint)(-fVar68 <= auVar54._0_4_);
        auVar78._8_4_ = -(uint)(-fVar99 <= auVar54._8_4_);
        auVar78._12_4_ = -(uint)(-fVar106 <= auVar54._12_4_);
        auVar98 = auVar98 | auVar78;
        iVar49 = movmskps((int)pRVar41,auVar98);
        if (iVar49 != 0) {
          auVar140._0_4_ = fVar107 * fVar110 - fVar124 * fVar123;
          auVar140._4_4_ = fVar111 * fVar112 - fVar126 * fVar125;
          auVar140._8_4_ = fVar113 * fVar114 - fVar128 * fVar127;
          auVar140._12_4_ = fVar115 * fVar116 - fVar130 * fVar129;
          auVar109._0_4_ = fVar124 * fVar66 - fVar53 * fVar110;
          auVar109._4_4_ = fVar126 * fVar69 - fVar67 * fVar112;
          auVar109._8_4_ = fVar128 * fVar86 - fVar85 * fVar114;
          auVar109._12_4_ = fVar130 * fVar105 - fVar104 * fVar116;
          auVar62._4_4_ = -(uint)(ABS(fVar126 * fVar125) < ABS(fVar67 * fVar112));
          auVar62._0_4_ = -(uint)(ABS(fVar124 * fVar123) < ABS(fVar53 * fVar110));
          auVar62._8_4_ = -(uint)(ABS(fVar128 * fVar127) < ABS(fVar85 * fVar114));
          auVar62._12_4_ = -(uint)(ABS(fVar130 * fVar129) < ABS(fVar104 * fVar116));
          local_a38 = blendvps(auVar109,auVar140,auVar62);
          auVar133._0_4_ = fVar152 * fVar110 - fVar117 * fVar66;
          auVar133._4_4_ = fVar156 * fVar112 - fVar120 * fVar69;
          auVar133._8_4_ = fVar159 * fVar114 - fVar121 * fVar86;
          auVar133._12_4_ = fVar161 * fVar116 - fVar122 * fVar105;
          auVar63._4_4_ = -(uint)(ABS(fStack_c14 * fVar112) < ABS(fVar120 * fVar69));
          auVar63._0_4_ = -(uint)(ABS(local_c18 * fVar110) < ABS(fVar117 * fVar66));
          auVar63._8_4_ = -(uint)(ABS(fStack_c10 * fVar114) < ABS(fVar121 * fVar86));
          auVar63._12_4_ = -(uint)(ABS(fStack_c0c * fVar116) < ABS(fVar122 * fVar105));
          auVar28._4_4_ = fVar125 * fVar120 - fStack_c14 * fVar112;
          auVar28._0_4_ = fVar123 * fVar117 - local_c18 * fVar110;
          auVar28._8_4_ = fVar127 * fVar121 - fStack_c10 * fVar114;
          auVar28._12_4_ = fVar129 * fVar122 - fStack_c0c * fVar116;
          local_a28 = blendvps(auVar133,auVar28,auVar63);
          auVar103._0_4_ = fVar117 * fVar53 - fVar152 * fVar124;
          auVar103._4_4_ = fVar120 * fVar67 - fVar156 * fVar126;
          auVar103._8_4_ = fVar121 * fVar85 - fVar159 * fVar128;
          auVar103._12_4_ = fVar122 * fVar104 - fVar161 * fVar130;
          auVar64._4_4_ = -(uint)(ABS(fVar120 * fVar111) < ABS(fVar156 * fVar126));
          auVar64._0_4_ = -(uint)(ABS(fVar117 * fVar107) < ABS(fVar152 * fVar124));
          fVar69 = (float)DAT_01f7ba10;
          fVar84 = DAT_01f7ba10._4_4_;
          fVar85 = DAT_01f7ba10._12_4_;
          auVar64._8_4_ = -(uint)(ABS(fVar121 * fVar113) < ABS(fVar159 * fVar128));
          auVar64._12_4_ = -(uint)(ABS(fVar122 * fVar115) < ABS(fVar161 * fVar130));
          auVar32._4_4_ = fStack_c14 * fVar126 - fVar120 * fVar111;
          auVar32._0_4_ = local_c18 * fVar124 - fVar117 * fVar107;
          auVar32._8_4_ = fStack_c10 * fVar128 - fVar121 * fVar113;
          auVar32._12_4_ = fStack_c0c * fVar130 - fVar122 * fVar115;
          local_a18 = blendvps(auVar103,auVar32,auVar64);
          fVar68 = fVar148 * local_a38._0_4_ +
                   fStack_cb4 * local_a28._0_4_ + fStack_c94 * local_a18._0_4_;
          fVar53 = fVar148 * local_a38._4_4_ +
                   fStack_cb4 * local_a28._4_4_ + fStack_c94 * local_a18._4_4_;
          fVar66 = fVar148 * local_a38._8_4_ +
                   fStack_cb4 * local_a28._8_4_ + fStack_c94 * local_a18._8_4_;
          fVar148 = fVar148 * local_a38._12_4_ +
                    fStack_cb4 * local_a28._12_4_ + fStack_c94 * local_a18._12_4_;
          auVar118._0_4_ = fVar68 + fVar68;
          auVar118._4_4_ = fVar53 + fVar53;
          auVar118._8_4_ = fVar66 + fVar66;
          auVar118._12_4_ = fVar148 + fVar148;
          auVar79._0_4_ = fVar134 * local_a18._0_4_;
          auVar79._4_4_ = fStack_c50 * local_a18._4_4_;
          auVar79._8_4_ = fVar135 * local_a18._8_4_;
          auVar79._12_4_ = fStack_aec * local_a18._12_4_;
          fVar86 = fVar136 * local_a38._0_4_ + fVar143 * local_a28._0_4_ + auVar79._0_4_;
          fVar99 = local_c58 * local_a38._4_4_ + fStack_c54 * local_a28._4_4_ + auVar79._4_4_;
          fVar104 = fVar137 * local_a38._8_4_ + fVar157 * local_a28._8_4_ + auVar79._8_4_;
          fVar105 = fVar141 * local_a38._12_4_ + fStack_adc * local_a28._12_4_ + auVar79._12_4_;
          auVar54 = rcpps(auVar79,auVar118);
          fVar68 = auVar54._0_4_;
          fVar148 = auVar54._4_4_;
          fVar66 = auVar54._8_4_;
          fVar67 = auVar54._12_4_;
          fVar53 = DAT_01f7ba10._8_4_;
          local_a48._0_4_ =
               ((fVar69 - auVar118._0_4_ * fVar68) * fVar68 + fVar68) * (fVar86 + fVar86);
          local_a48._4_4_ =
               ((fVar84 - auVar118._4_4_ * fVar148) * fVar148 + fVar148) * (fVar99 + fVar99);
          fStack_a40 = ((fVar53 - auVar118._8_4_ * fVar66) * fVar66 + fVar66) * (fVar104 + fVar104);
          fStack_a3c = ((fVar85 - auVar118._12_4_ * fVar67) * fVar67 + fVar67) * (fVar105 + fVar105)
          ;
          fVar68 = *(float *)(ray + k * 4 + 0x80);
          fVar148 = *(float *)(ray + k * 4 + 0x30);
          auVar94._4_4_ = -(uint)(fVar148 <= (float)local_a48._4_4_);
          auVar94._0_4_ = -(uint)(fVar148 <= (float)local_a48._0_4_);
          auVar94._8_4_ = -(uint)(fVar148 <= fStack_a40);
          auVar94._12_4_ = -(uint)(fVar148 <= fStack_a3c);
          auVar80._0_4_ =
               -(uint)((float)local_a48._0_4_ <= fVar68 && fVar148 <= (float)local_a48._0_4_) &
               auVar98._0_4_;
          auVar80._4_4_ =
               -(uint)((float)local_a48._4_4_ <= fVar68 && fVar148 <= (float)local_a48._4_4_) &
               auVar98._4_4_;
          auVar80._8_4_ = -(uint)(fStack_a40 <= fVar68 && fVar148 <= fStack_a40) & auVar98._8_4_;
          auVar80._12_4_ = -(uint)(fStack_a3c <= fVar68 && fVar148 <= fStack_a3c) & auVar98._12_4_;
          iVar49 = movmskps(iVar49,auVar80);
          if ((iVar49 != 0) &&
             (auVar81._0_4_ = auVar80._0_4_ & -(uint)(auVar118._0_4_ != 0.0),
             auVar81._4_4_ = auVar80._4_4_ & -(uint)(auVar118._4_4_ != 0.0),
             auVar81._8_4_ = auVar80._8_4_ & -(uint)(auVar118._8_4_ != 0.0),
             auVar81._12_4_ = auVar80._12_4_ & -(uint)(auVar118._12_4_ != 0.0),
             uVar42 = movmskps(iVar49,auVar81), uVar42 != 0)) {
            auVar35._4_4_ = fVar149;
            auVar35._0_4_ = fVar131;
            auVar35._8_4_ = fVar150;
            auVar35._12_4_ = fVar151;
            local_a08._4_4_ = uVar37;
            local_a08._0_4_ = uVar36;
            local_a08._8_4_ = uVar38;
            local_a08._12_4_ = uVar39;
            pSVar45 = context->scene;
            auVar54 = rcpps(auVar94,auVar35);
            fVar148 = auVar54._0_4_;
            fVar66 = auVar54._4_4_;
            fVar67 = auVar54._8_4_;
            fVar86 = auVar54._12_4_;
            fVar148 = (float)(-(uint)(1e-18 <= ABS(fVar131)) &
                             (uint)((fVar69 - fVar131 * fVar148) * fVar148 + fVar148));
            fVar66 = (float)(-(uint)(1e-18 <= ABS(fVar149)) &
                            (uint)((fVar84 - fVar149 * fVar66) * fVar66 + fVar66));
            fVar67 = (float)(-(uint)(1e-18 <= ABS(fVar150)) &
                            (uint)((fVar53 - fVar150 * fVar67) * fVar67 + fVar67));
            fVar86 = (float)(-(uint)(1e-18 <= ABS(fVar151)) &
                            (uint)((fVar85 - fVar151 * fVar86) * fVar86 + fVar86));
            auVar119._0_4_ = fVar138 * fVar148;
            auVar119._4_4_ = fVar142 * fVar66;
            auVar119._8_4_ = fVar144 * fVar67;
            auVar119._12_4_ = fVar146 * fVar86;
            auVar54 = minps(auVar119,_DAT_01f7ba10);
            auVar155._0_4_ = fVar148 * fVar145;
            auVar155._4_4_ = fVar66 * fVar153;
            auVar155._8_4_ = fVar67 * fVar158;
            auVar155._12_4_ = fVar86 * fVar160;
            auVar71 = minps(auVar155,_DAT_01f7ba10);
            auVar82._0_4_ = fVar69 - auVar54._0_4_;
            auVar82._4_4_ = fVar84 - auVar54._4_4_;
            auVar82._8_4_ = fVar53 - auVar54._8_4_;
            auVar82._12_4_ = fVar85 - auVar54._12_4_;
            auVar95._0_4_ = fVar69 - auVar71._0_4_;
            auVar95._4_4_ = fVar84 - auVar71._4_4_;
            auVar95._8_4_ = fVar53 - auVar71._8_4_;
            auVar95._12_4_ = fVar85 - auVar71._12_4_;
            local_a68 = blendvps(auVar54,auVar82,local_a08);
            local_a58 = blendvps(auVar71,auVar95,local_a08);
            uVar48 = (ulong)(uVar42 & 0xff);
            do {
              uVar24 = 0;
              if (uVar48 != 0) {
                for (; (uVar48 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              local_998 = puVar47[uVar24];
              pGVar21 = (pSVar45->geometries).items[local_998].ptr;
              if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0027e8e6:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar52;
                }
                local_9c8 = *(undefined4 *)(local_a68 + uVar24 * 4);
                uVar14 = *(undefined4 *)(local_a58 + uVar24 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_a48 + uVar24 * 4);
                args.context = context->user;
                local_9a8 = *(undefined4 *)(local_bf8 + 0x50 + uVar24 * 4);
                local_9b8._4_4_ = uVar14;
                local_9b8._0_4_ = uVar14;
                local_9b8._8_4_ = uVar14;
                local_9b8._12_4_ = uVar14;
                uVar14 = *(undefined4 *)(local_a38 + uVar24 * 4);
                uVar15 = *(undefined4 *)(local_a28 + uVar24 * 4);
                local_9d8 = *(undefined4 *)(local_a18 + uVar24 * 4);
                local_9e8._4_4_ = uVar15;
                local_9e8._0_4_ = uVar15;
                local_9e8._8_4_ = uVar15;
                local_9e8._12_4_ = uVar15;
                local_9f8[0] = (RTCHitN)(char)uVar14;
                local_9f8[1] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_9f8[2] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_9f8[3] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_9f8[4] = (RTCHitN)(char)uVar14;
                local_9f8[5] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_9f8[6] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_9f8[7] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_9f8[8] = (RTCHitN)(char)uVar14;
                local_9f8[9] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_9f8[10] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_9f8[0xb] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_9f8[0xc] = (RTCHitN)(char)uVar14;
                local_9f8[0xd] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_9f8[0xe] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_9f8[0xf] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                uStack_9d4 = local_9d8;
                uStack_9d0 = local_9d8;
                uStack_9cc = local_9d8;
                uStack_9c4 = local_9c8;
                uStack_9c0 = local_9c8;
                uStack_9bc = local_9c8;
                uStack_9a4 = local_9a8;
                uStack_9a0 = local_9a8;
                uStack_99c = local_9a8;
                uStack_994 = local_998;
                uStack_990 = local_998;
                uStack_98c = local_998;
                local_988 = (args.context)->instID[0];
                uStack_984 = local_988;
                uStack_980 = local_988;
                uStack_97c = local_988;
                local_978 = (args.context)->instPrimID[0];
                uStack_974 = local_978;
                uStack_970 = local_978;
                uStack_96c = local_978;
                local_c38 = *local_bf0;
                args.valid = (int *)local_c38;
                args.geometryUserPtr = pGVar21->userPtr;
                args.hit = local_9f8;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar21->occlusionFilterN)(&args);
                }
                if (local_c38 == (undefined1  [16])0x0) {
                  auVar83._8_4_ = 0xffffffff;
                  auVar83._0_8_ = 0xffffffffffffffff;
                  auVar83._12_4_ = 0xffffffff;
                  auVar83 = auVar83 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var22 = context->args->filter;
                  if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar21->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var22)(&args);
                  }
                  auVar65._0_4_ = -(uint)(local_c38._0_4_ == 0);
                  auVar65._4_4_ = -(uint)(local_c38._4_4_ == 0);
                  auVar65._8_4_ = -(uint)(local_c38._8_4_ == 0);
                  auVar65._12_4_ = -(uint)(local_c38._12_4_ == 0);
                  auVar83 = auVar65 ^ _DAT_01f7ae20;
                  auVar54 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar65);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar54;
                }
                if ((_DAT_01f7bb20 & auVar83) != (undefined1  [16])0x0) goto LAB_0027e8e6;
                *(float *)(ray + k * 4 + 0x80) = fVar68;
              }
              uVar48 = uVar48 ^ 1L << (uVar24 & 0x3f);
            } while (uVar48 != 0);
          }
        }
        pauVar43 = (undefined1 (*) [16])(*pauVar43 + 1);
      } while (pauVar43 != (undefined1 (*) [16])(uVar40 - 8));
    }
LAB_0027e8c6:
    bVar52 = pNVar46 != stack;
    if (!bVar52) {
      return bVar52;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }